

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_disable(InstanceBuilder *this,VkValidationCheckEXT check)

{
  VkValidationCheckEXT local_c;
  
  local_c = check;
  std::vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>::push_back
            (&(this->info).disabled_validation_checks,&local_c);
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_disable(VkValidationCheckEXT check) {
    info.disabled_validation_checks.push_back(check);
    return *this;
}